

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Opnd * __thiscall
GlobOpt::CopyPropReplaceOpnd
          (GlobOpt *this,Instr *instr,Opnd *opnd,StackSym *copySym,IndirOpnd *parentIndirOpnd)

{
  undefined1 *puVar1;
  OpCode OVar2;
  Type pJVar3;
  BasicBlock *block;
  code *pcVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar6;
  RegOpnd *regOpnd;
  SymOpnd *pSVar7;
  PropertySymOpnd *opnd_00;
  PropertySymOpnd *opnd_01;
  Instr *pIVar8;
  BVSparse<Memory::JitArenaAllocator> *instrByteCodeStackSymUsed;
  Value *src1Val;
  RegOpnd *pRVar9;
  StackSym *pSVar10;
  StackSym *pSVar11;
  uint uVar12;
  ulong uVar13;
  PropertySym *local_58;
  PropertySym *tempPropertySymUse;
  PropertySymOpnd *local_48;
  PropertySymOpnd *local_40;
  StackSym *local_38;
  
  local_38 = copySym;
  if (parentIndirOpnd == (IndirOpnd *)0x0) {
    if (((instr->m_src1 != opnd) && (instr->m_src2 != opnd)) &&
       ((instr->m_dst != opnd || (bVar5 = IR::Opnd::IsIndirOpnd(opnd), !bVar5)))) goto LAB_0042c564;
  }
  else if ((parentIndirOpnd->m_baseOpnd != (RegOpnd *)opnd) &&
          (parentIndirOpnd->m_indexOpnd != (RegOpnd *)opnd)) {
LAB_0042c564:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xfa6,
                       "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                       ,
                       "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                      );
    if (!bVar5) goto LAB_0042cc03;
    *puVar6 = 0;
  }
  bVar5 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,&local_38->super_Sym);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xfa7,"(CurrentBlockData()->IsLive(copySym))",
                       "CurrentBlockData()->IsLive(copySym)");
    if (!bVar5) goto LAB_0042cc03;
    *puVar6 = 0;
  }
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,sourceContextId,functionId);
  if (bVar5) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    IR::Opnd::Dump(opnd);
    Output::Print(L" : ");
    Output::Print(L"Copy prop s%d\n",(ulong)(local_38->super_Sym).m_id);
    Output::Flush();
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,FieldCopyPropPhase);
  if (bVar5) {
    IR::Instr::DumpFieldCopyPropTestTrace(instr,SUB41((*(uint *)&this->field_0xf4 & 0x20) >> 5,0));
  }
  CaptureByteCodeSymUses(this,instr);
  bVar5 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar5) {
    regOpnd = IR::Opnd::AsRegOpnd(opnd);
    regOpnd->m_sym = local_38;
    IR::Opnd::SetIsJITOptimizedReg(&regOpnd->super_Opnd,true);
    puVar1 = &(regOpnd->super_Opnd).field_0xb;
    *puVar1 = *puVar1 & 0xfb;
    if (parentIndirOpnd != (IndirOpnd *)0x0) {
      return &regOpnd->super_Opnd;
    }
  }
  else {
    if ((this->currentBlock->loop != (Loop *)0x0) && (bVar5 = IR::Opnd::IsSymOpnd(opnd), bVar5)) {
      pSVar7 = IR::Opnd::AsSymOpnd(opnd);
      bVar5 = IR::SymOpnd::IsPropertySymOpnd(pSVar7);
      if (bVar5) {
        opnd_00 = IR::Opnd::AsPropertySymOpnd(opnd);
        bVar5 = CheckIfPropOpEmitsTypeCheck(this,instr,opnd_00);
        if (bVar5) {
          if (opnd_00->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xfd1,"(propertySymOpnd->GetGuardedPropOps() == nullptr)",
                               "propertySymOpnd->GetGuardedPropOps() == nullptr");
            if (!bVar5) goto LAB_0042cc03;
            *puVar6 = 0;
          }
          opnd_01 = CreateOpndForTypeCheckOnly(this,opnd_00,instr->m_func);
          local_48 = opnd_00;
          pIVar8 = IR::Instr::New(CheckObjType,instr->m_func);
          IR::Instr::SetSrc1(pIVar8,(Opnd *)opnd_01);
          IR::Instr::SetByteCodeOffset(pIVar8,instr);
          IR::Instr::InsertBefore(instr,pIVar8);
          local_40 = opnd_01;
          FinishOptPropOp(this,pIVar8,opnd_01,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
          if (((local_48->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xfdf,"(!propertySymOpnd->IsTypeChecked())",
                               "!propertySymOpnd->IsTypeChecked()");
            if (!bVar5) goto LAB_0042cc03;
            *puVar6 = 0;
          }
          pIVar8 = SetTypeCheckBailOut(this,(Opnd *)local_40,pIVar8,(BailOutInfo *)0x0);
          if ((pIVar8->field_0x38 & 0x10) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xfe1,"(checkObjTypeInstr->HasBailOutInfo())",
                               "checkObjTypeInstr->HasBailOutInfo()");
            if (!bVar5) {
LAB_0042cc03:
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar6 = 0;
          }
          if ((this->currentBlock->loop != (Loop *)0x0) && (this->prePassLoop == (Loop *)0x0)) {
            local_48 = (PropertySymOpnd *)this->byteCodeUses;
            local_40 = (PropertySymOpnd *)this->propertySymUse;
            local_58 = (PropertySym *)0x0;
            this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
            instrByteCodeStackSymUsed =
                 (BVSparse<Memory::JitArenaAllocator> *)
                 new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3d6ef4);
            pJVar3 = this->tempAlloc;
            instrByteCodeStackSymUsed->head = (Type_conflict)0x0;
            instrByteCodeStackSymUsed->lastFoundIndex = (Type_conflict)0x0;
            instrByteCodeStackSymUsed->alloc = pJVar3;
            instrByteCodeStackSymUsed->lastUsedNodePrevNextField = (Type)instrByteCodeStackSymUsed;
            tempPropertySymUse = (PropertySym *)this->byteCodeUsesBeforeOpt;
            this->byteCodeUsesBeforeOpt = instrByteCodeStackSymUsed;
            this->propertySymUse = (PropertySym *)0x0;
            TrackByteCodeSymUsed(pIVar8,instrByteCodeStackSymUsed,&local_58);
            block = this->currentBlock;
            src1Val = GlobOptBlockData::FindValue(&block->globOptData,&local_38->super_Sym);
            TryHoistInvariant(this,pIVar8,block,(Value *)0x0,src1Val,(Value *)0x0,true,false,false,
                              BailOutInvalid);
            this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)local_48;
            this->propertySymUse = (PropertySym *)local_40;
            this->byteCodeUsesBeforeOpt = (BVSparse<Memory::JitArenaAllocator> *)tempPropertySymUse;
          }
        }
      }
    }
    bVar5 = IR::Opnd::IsSymOpnd(opnd);
    if ((bVar5) && ((opnd->field_0xb & 4) != 0)) {
      pSVar7 = IR::Opnd::AsSymOpnd(opnd);
      EndFieldLifetime(this,pSVar7);
    }
    regOpnd = IR::RegOpnd::New(local_38,opnd->m_type,instr->m_func);
    IR::Opnd::SetIsJITOptimizedReg(&regOpnd->super_Opnd,true);
    IR::Instr::ReplaceSrc(instr,opnd,&regOpnd->super_Opnd);
  }
  OVar2 = instr->m_opcode;
  uVar13 = (ulong)(OVar2 - 0x2b);
  if (OVar2 - 0x2b < 0x40) {
    if ((0xa808000000000000U >> (uVar13 & 0x3f) & 1) == 0) {
      if (uVar13 == 0) {
        instr->m_opcode = Typeof;
        goto LAB_0042cafa;
      }
      if (uVar13 != 0x1a) goto LAB_0042ca7c;
      bVar5 = IR::Opnd::IsRegOpnd(instr->m_dst);
      if ((!bVar5) || (bVar5 = IR::Opnd::IsRegOpnd(instr->m_src1), !bVar5)) goto LAB_0042cafa;
      pRVar9 = IR::Opnd::AsRegOpnd(instr->m_dst);
      pSVar10 = IR::Opnd::GetStackSym(&pRVar9->super_Opnd);
      pRVar9 = IR::Opnd::AsRegOpnd(instr->m_src1);
      pSVar11 = IR::Opnd::GetStackSym(&pRVar9->super_Opnd);
      if (pSVar10 != pSVar11) goto LAB_0042cafa;
LAB_0042cbcc:
      InsertByteCodeUses(this,instr,true);
      instr->m_opcode = Nop;
      goto LAB_0042cafa;
    }
  }
  else {
LAB_0042ca7c:
    uVar12 = OVar2 - 0x6c;
    if (uVar12 < 0x21) {
      if ((0x3000005UL >> ((ulong)uVar12 & 0x3f) & 1) != 0) goto LAB_0042caf4;
      if ((ulong)uVar12 != 0x20) goto LAB_0042ca99;
    }
    else {
LAB_0042ca99:
      if ((OVar2 == LdRootFldForTypeOf) || (OVar2 == ScopedLdFldForTypeOf)) goto LAB_0042caf4;
      if (OVar2 == LdMethodFromFlags) {
        instr->m_opcode = Ld_A;
        IR::Instr::ClearBailOutInfo(instr);
        goto LAB_0042cafa;
      }
      if (OVar2 != LdSlotArr) {
        if ((OVar2 == StSlotChkUndecl) && (bVar5 = IR::Opnd::IsRegOpnd(instr->m_src2), bVar5)) {
          instr->m_opcode = StSlot;
          IR::Instr::FreeSrc2(instr);
          return (Opnd *)0x0;
        }
        goto LAB_0042cafa;
      }
    }
    bVar5 = IR::Opnd::IsRegOpnd(instr->m_dst);
    if ((bVar5) && (bVar5 = IR::Opnd::IsRegOpnd(instr->m_src1), bVar5)) {
      pRVar9 = IR::Opnd::AsRegOpnd(instr->m_dst);
      pSVar10 = IR::Opnd::GetStackSym(&pRVar9->super_Opnd);
      pRVar9 = IR::Opnd::AsRegOpnd(instr->m_src1);
      pSVar11 = IR::Opnd::GetStackSym(&pRVar9->super_Opnd);
      if (pSVar10 == pSVar11) goto LAB_0042cbcc;
    }
  }
LAB_0042caf4:
  instr->m_opcode = Ld_A;
LAB_0042cafa:
  GlobOptBlockData::MarkTempLastUse(&this->currentBlock->globOptData,instr,regOpnd);
  return &regOpnd->super_Opnd;
}

Assistant:

IR::Opnd *
GlobOpt::CopyPropReplaceOpnd(IR::Instr * instr, IR::Opnd * opnd, StackSym * copySym, IR::IndirOpnd *parentIndirOpnd)
{
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());
    Assert(CurrentBlockData()->IsLive(copySym));

    IR::RegOpnd *regOpnd;
    StackSym *newSym = copySym;

    GOPT_TRACE_OPND(opnd, _u("Copy prop s%d\n"), newSym->m_id);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    //Need to update DumpFieldCopyPropTestTrace for every new opcode that is added for fieldcopyprop
    if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FieldCopyPropPhase))
    {
        instr->DumpFieldCopyPropTestTrace(this->isRecursiveCallOnLandingPad);
    }
#endif

    this->CaptureByteCodeSymUses(instr);
    if (opnd->IsRegOpnd())
    {
        regOpnd = opnd->AsRegOpnd();
        regOpnd->m_sym = newSym;
        regOpnd->SetIsJITOptimizedReg(true);

        // The dead bit on the opnd is specific to the sym it is referencing. Since we replaced the sym, the bit is reset.
        regOpnd->SetIsDead(false);

        if(parentIndirOpnd)
        {
            return regOpnd;
        }
    }
    else
    {
        // If this is an object type specialized field load inside a loop, and it produces a type value which wasn't live
        // before, make sure the type check is left in the loop, because it may be the last type check in the loop protecting
        // other fields which are not hoistable and are lexically upstream in the loop.  If the check is not ultimately
        // needed, the dead store pass will remove it.
        if (this->currentBlock->loop != nullptr && opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            IR::PropertySymOpnd* propertySymOpnd = opnd->AsPropertySymOpnd();
            if (CheckIfPropOpEmitsTypeCheck(instr, propertySymOpnd))
            {
                // We only set guarded properties in the dead store pass, so they shouldn't be set here yet. If they were
                // we would need to move them from this operand to the operand which is being copy propagated.
                Assert(propertySymOpnd->GetGuardedPropOps() == nullptr);

                // We're creating a copy of this operand to be reused in the same spot in the flow, so we can copy all
                // flow sensitive fields.  However, we will do only a type check here (no property access) and only for
                // the sake of downstream instructions, so the flags pertaining to this property access are irrelevant.
                IR::PropertySymOpnd* checkObjTypeOpnd = CreateOpndForTypeCheckOnly(propertySymOpnd, instr->m_func);
                IR::Instr* checkObjTypeInstr = IR::Instr::New(Js::OpCode::CheckObjType, instr->m_func);
                checkObjTypeInstr->SetSrc1(checkObjTypeOpnd);
                checkObjTypeInstr->SetByteCodeOffset(instr);
                instr->InsertBefore(checkObjTypeInstr);

                // Since we inserted this instruction before the one that is being processed in natural flow, we must process
                // it for object type spec explicitly here.
                FinishOptPropOp(checkObjTypeInstr, checkObjTypeOpnd);
                Assert(!propertySymOpnd->IsTypeChecked());
                checkObjTypeInstr = this->SetTypeCheckBailOut(checkObjTypeOpnd, checkObjTypeInstr, nullptr);
                Assert(checkObjTypeInstr->HasBailOutInfo());

                if (this->currentBlock->loop && !this->IsLoopPrePass())
                {
                    // Try hoisting this checkObjType.
                    // But since this isn't the current instr being optimized, we need to play tricks with
                    // the byteCodeUse fields...
                    TrackByteCodeUsesForInstrAddedInOptInstr(checkObjTypeInstr, [&]()
                    {
                        TryHoistInvariant(checkObjTypeInstr, this->currentBlock, NULL, CurrentBlockData()->FindValue(copySym), NULL, true);
                    });
                }
            }
        }

        if (opnd->IsSymOpnd() && opnd->GetIsDead())
        {
            // Take the property sym out of the live fields set
            this->EndFieldLifetime(opnd->AsSymOpnd());
        }
        regOpnd = IR::RegOpnd::New(newSym, opnd->GetType(), instr->m_func);
        regOpnd->SetIsJITOptimizedReg(true);
        instr->ReplaceSrc(opnd, regOpnd);
    }

    switch (instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
        if (instr->GetDst()->IsRegOpnd() && instr->GetSrc1()->IsRegOpnd() &&
            instr->GetDst()->AsRegOpnd()->GetStackSym() == instr->GetSrc1()->AsRegOpnd()->GetStackSym())
        {
            this->InsertByteCodeUses(instr, true);
            instr->m_opcode = Js::OpCode::Nop;
        }
        break;

    case Js::OpCode::LdSlot:
    case Js::OpCode::LdSlotArr:
        if (instr->GetDst()->IsRegOpnd() && instr->GetSrc1()->IsRegOpnd() &&
            instr->GetDst()->AsRegOpnd()->GetStackSym() == instr->GetSrc1()->AsRegOpnd()->GetStackSym())
        {
            this->InsertByteCodeUses(instr, true);
            instr->m_opcode = Js::OpCode::Nop;
        }
        else
        {
            instr->m_opcode = Js::OpCode::Ld_A;
        }
        break;

    case Js::OpCode::StSlotChkUndecl:
        if (instr->GetSrc2()->IsRegOpnd())
        {
            // Src2 here should refer to the same location as the Dst operand, which we need to keep live
            // due to the implicit read for ChkUndecl.
            instr->m_opcode = Js::OpCode::StSlot;
            instr->FreeSrc2();
            return nullptr;
        }
        break;

    case Js::OpCode::LdFld:
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdRootFldForTypeOf:
    case Js::OpCode::LdFldForCallApplyTarget:
    case Js::OpCode::LdRootFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdRootMethodFld:
    case Js::OpCode::ScopedLdMethodFld:
    case Js::OpCode::ScopedLdFld:
    case Js::OpCode::ScopedLdFldForTypeOf:
        instr->m_opcode = Js::OpCode::Ld_A;
        break;

    case Js::OpCode::LdMethodFromFlags:
        // The bailout is checked on the loop top and we don't need to check bailout again in loop.
        instr->m_opcode = Js::OpCode::Ld_A;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::TypeofElem:
        instr->m_opcode = Js::OpCode::Typeof;
        break;
    }
    CurrentBlockData()->MarkTempLastUse(instr, regOpnd);

    return regOpnd;
}